

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::updateMarginAndSpacing(QToolBarLayout *this)

{
  int right;
  int iVar1;
  undefined4 uVar2;
  QToolBar *pQVar3;
  QStyle *pQVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  int margin;
  QStyle *style;
  QToolBar *tb;
  QStyleOptionToolBar opt;
  QWidget *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget((QLayout *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  pQVar3 = qobject_cast<QToolBar*>((QObject *)0x6fbfa8);
  if (pQVar3 != (QToolBar *)0x0) {
    pQVar4 = QWidget::style(in_stack_ffffffffffffff68);
    memset(local_60,0xaa,0x58);
    QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6fbfe7);
    (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1a0))(pQVar3,local_60);
    right = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x37,local_60,pQVar3);
    iVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x34,local_60,pQVar3);
    QLayout::setContentsMargins
              ((QLayout *)CONCAT44(right + iVar1,in_stack_ffffffffffffff80),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,right,in_stack_ffffffffffffff70);
    uVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x36,local_60,pQVar3);
    (**(code **)(*in_RDI + 0x68))(in_RDI,uVar2);
    QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6fc093);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarLayout::updateMarginAndSpacing()
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int margin = style->pixelMetric(QStyle::PM_ToolBarItemMargin, &opt, tb)
            + style->pixelMetric(QStyle::PM_ToolBarFrameWidth, &opt, tb);
    setContentsMargins(margin, margin, margin, margin);
    setSpacing(style->pixelMetric(QStyle::PM_ToolBarItemSpacing, &opt, tb));
}